

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char local_70 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  size_type local_20;
  pointer local_18;
  undefined8 local_10;
  
  local_50.first._M_str = (a->_M_dataplus)._M_p;
  local_50.first._M_len = a->_M_string_length;
  local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70[0] = *b;
  local_30 = local_70;
  local_38 = 1;
  local_28 = 0;
  local_18 = (args->_M_dataplus)._M_p;
  local_20 = args->_M_string_length;
  local_10 = 0;
  views._M_len = 3;
  views._M_array = &local_50;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}